

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O0

int32_t calculate_from_value(value_sec *value,int range_index)

{
  int range_index_local;
  value_sec *value_local;
  
  switch(value->type) {
  case VT_RANGE_INDEX:
    value_local._4_4_ = range_index;
    break;
  case VT_TRAIT:
    value_local._4_4_ = borg.trait[value->index];
    break;
  case VT_CONFIG:
    value_local._4_4_ = borg_cfg[value->index];
    break;
  case VT_ACTIVATION:
    value_local._4_4_ = borg.activation[value->index];
    break;
  case VT_CLASS:
    value_local._4_4_ = (uint)(borg.trait[0x19] == value->index);
    break;
  default:
    value_local._4_4_ = borg.has[value->index];
  }
  return value_local._4_4_;
}

Assistant:

int32_t calculate_from_value(struct value_sec *value, int range_index)
{
    switch (value->type) {

    case VT_ACTIVATION:
        return borg.activation[value->index];

    case VT_TRAIT:
        return borg.trait[value->index];

    case VT_CONFIG:
        return borg_cfg[value->index];

    case VT_CLASS:
        return borg.trait[BI_CLASS] == value->index;

    case VT_RANGE_INDEX:
        return range_index;

    default:
        return borg.has[value->index];
    }
}